

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

expansion * __thiscall
GEO::expansion::assign_sum(expansion *this,expansion *a,expansion *b,expansion *c,expansion *d)

{
  index_t iVar1;
  index_t iVar2;
  long lVar3;
  ulong uVar4;
  expansion *this_00;
  expansion *this_01;
  double dStack_40;
  index_t aiStack_38 [2];
  
  iVar1 = a->length_;
  iVar2 = b->length_;
  uVar4 = (ulong)(iVar1 + iVar2 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  lVar3 = -uVar4;
  this_00 = (expansion *)((long)aiStack_38 + lVar3);
  *(undefined4 *)((long)aiStack_38 - uVar4) = 0;
  *(index_t *)((long)aiStack_38 + lVar3 + 4) = iVar2 + iVar1;
  *(undefined8 *)((long)&dStack_40 + lVar3) = 0x144e3b;
  assign_sum(this_00,a,b);
  iVar1 = c->length_;
  iVar2 = d->length_;
  uVar4 = (ulong)(iVar1 + iVar2 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  this_01 = (expansion *)((long)this_00 - uVar4);
  *(undefined4 *)((long)this_00 - uVar4) = 0;
  this_01->capacity_ = iVar2 + iVar1;
  this_01[-1].x_[1] = 6.57507502141989e-318;
  assign_sum(this_01,c,d);
  this_01[-1].x_[1] = 6.57514419061031e-318;
  assign_sum(this,this_00,this_01);
  return this;
}

Assistant:

expansion& expansion::assign_sum(
        const expansion& a, const expansion& b,
        const expansion& c, const expansion& d
    ) {
        geo_debug_assert(capacity() >= sum_capacity(a, b, c));
        expansion& ab = expansion_sum(a, b);
        expansion& cd = expansion_sum(c, d);
        this->assign_sum(ab, cd);
        return *this;
    }